

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool __thiscall leveldb::Compaction::IsTrivialMove(Compaction *this)

{
  VersionSet *pVVar1;
  size_t sVar2;
  int64_t iVar3;
  long lVar4;
  
  if ((((long)this->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)this->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 8) &&
     (((long)this->inputs_[1].
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)this->inputs_[1].
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 0)) {
    pVVar1 = this->input_version_->vset_;
    iVar3 = TotalFileSize(&this->grandparents_);
    sVar2 = pVVar1->options_->max_file_size;
    lVar4 = sVar2 * 10;
    return iVar3 == lVar4 || SBORROW8(iVar3,lVar4) != (long)(iVar3 + sVar2 * -10) < 0;
  }
  return false;
}

Assistant:

bool Compaction::IsTrivialMove() const {
  const VersionSet* vset = input_version_->vset_;
  // Avoid a move if there is lots of overlapping grandparent data.
  // Otherwise, the move could create a parent file that will require
  // a very expensive merge later on.
  return (num_input_files(0) == 1 && num_input_files(1) == 0 &&
          TotalFileSize(grandparents_) <=
              MaxGrandParentOverlapBytes(vset->options_));
}